

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDict
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *out_dict)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  mapped_type *this_00;
  long lVar7;
  char *pcVar8;
  string key;
  ostringstream ss_e;
  string local_220;
  storage_union local_200;
  undefined8 *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  undefined8 local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar4 = Expect(this,'{');
  if ((bVar4) && (bVar4 = SkipCommentAndWhitespaceAndNewline(this,true), bVar4)) {
    do {
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (((pSVar2->length_ <= uVar3) || (uVar1 = pSVar2->binary_[uVar3], uVar1 == '\0')) ||
         (pSVar2->idx_ = uVar3 + 1, uVar1 == '}')) {
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        return bVar4;
      }
      if ((long)uVar3 < 0) {
        return false;
      }
      pSVar2->idx_ = uVar3;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      local_1f0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_200.dynamic = (void *)0x0;
      local_1e0 = 0;
      local_1d8._M_local_buf[0] = '\0';
      local_1e8 = &local_1d8;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      bVar4 = ParseDictElement(this,&local_1c8,(MetaVariable *)&local_200);
      if (bVar4) {
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) goto LAB_003c1ef5;
        if ((local_1f0 != (undefined8 *)0x0) && (iVar5 = (*(code *)*local_1f0)(), iVar5 == 1)) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ParseDict",9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x3ca);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          lVar7 = 0x2e;
          pcVar8 = "Invalid Dict element(probably internal issue).";
          goto LAB_003c1e84;
        }
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  ::operator[](out_dict,&local_1c8);
        ::std::__cxx11::string::_M_assign((string *)&this_00->_name);
        linb::any::operator=((any *)this_00,(any *)&local_200);
        bVar4 = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ParseDict",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar7 = 0x1d;
        pcVar8 = "Failed to parse dict element.";
LAB_003c1e84:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
LAB_003c1ef5:
        bVar4 = false;
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,
                        CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) +
                        1);
      }
      if (local_1f0 != (undefined8 *)0x0) {
        (*(code *)local_1f0[4])(&local_200);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar4);
  }
  return false;
}

Assistant:

bool AsciiParser::ParseDict(std::map<std::string, MetaVariable> *out_dict) {
  // '{' comment | (type name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      MetaVariable var;
      if (!ParseDictElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse dict element.");
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      if (!var.is_valid()) {
        PUSH_ERROR_AND_RETURN("Invalid Dict element(probably internal issue).");
      }

      DCOUT("Add to dict: " << key);
      (*out_dict)[key] = var;
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  return true;
}